

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binary_executor.hpp
# Opt level: O3

void duckdb::BinaryExecutor::
     ExecuteGenericLoop<short,short,short,duckdb::BinaryStandardOperatorWrapper,duckdb::BitwiseXOROperator,bool>
               (short *ldata,short *rdata,short *result_data,SelectionVector *lsel,
               SelectionVector *rsel,idx_t count,ValidityMask *lvalidity,ValidityMask *rvalidity,
               ValidityMask *result_validity,bool fun)

{
  sel_t *psVar1;
  sel_t *psVar2;
  unsigned_long *puVar3;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this;
  byte bVar4;
  element_type *peVar5;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var6;
  ulong uVar7;
  TemplatedValidityData<unsigned_long> *pTVar8;
  _Head_base<0UL,_unsigned_long_*,_false> _Var9;
  ulong uVar10;
  idx_t idx_in_entry;
  ulong uVar11;
  element_type *local_68;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Stack_60;
  buffer_ptr<ValidityBuffer> *local_50;
  short *local_48;
  short *local_40;
  idx_t local_38;
  
  if ((rvalidity->super_TemplatedValidityMask<unsigned_long>).validity_mask == (unsigned_long *)0x0
      && (lvalidity->super_TemplatedValidityMask<unsigned_long>).validity_mask ==
         (unsigned_long *)0x0) {
    if (count != 0) {
      psVar1 = lsel->sel_vector;
      psVar2 = rsel->sel_vector;
      uVar11 = 0;
      do {
        uVar7 = uVar11;
        if (psVar1 != (sel_t *)0x0) {
          uVar7 = (ulong)psVar1[uVar11];
        }
        uVar10 = uVar11;
        if (psVar2 != (sel_t *)0x0) {
          uVar10 = (ulong)psVar2[uVar11];
        }
        result_data[uVar11] = ldata[uVar7] ^ rdata[uVar10];
        uVar11 = uVar11 + 1;
      } while (count != uVar11);
    }
  }
  else if (count != 0) {
    psVar1 = lsel->sel_vector;
    psVar2 = rsel->sel_vector;
    local_50 = &(result_validity->super_TemplatedValidityMask<unsigned_long>).validity_data;
    uVar11 = 0;
    local_48 = rdata;
    local_40 = result_data;
    do {
      uVar7 = uVar11;
      if (psVar1 != (sel_t *)0x0) {
        uVar7 = (ulong)psVar1[uVar11];
      }
      uVar10 = uVar11;
      if (psVar2 != (sel_t *)0x0) {
        uVar10 = (ulong)psVar2[uVar11];
      }
      puVar3 = (lvalidity->super_TemplatedValidityMask<unsigned_long>).validity_mask;
      if (((puVar3 == (unsigned_long *)0x0) || ((puVar3[uVar7 >> 6] >> (uVar7 & 0x3f) & 1) != 0)) &&
         ((puVar3 = (rvalidity->super_TemplatedValidityMask<unsigned_long>).validity_mask,
          puVar3 == (unsigned_long *)0x0 || ((puVar3[uVar10 >> 6] >> (uVar10 & 0x3f) & 1) != 0)))) {
        result_data[uVar11] = rdata[uVar10] ^ ldata[uVar7];
      }
      else {
        _Var9._M_head_impl =
             (result_validity->super_TemplatedValidityMask<unsigned_long>).validity_mask;
        if (_Var9._M_head_impl == (unsigned_long *)0x0) {
          local_38 = (result_validity->super_TemplatedValidityMask<unsigned_long>).capacity;
          make_buffer<duckdb::TemplatedValidityData<unsigned_long>,unsigned_long&>
                    ((duckdb *)&local_68,&local_38);
          p_Var6 = p_Stack_60;
          peVar5 = local_68;
          local_68 = (element_type *)0x0;
          p_Stack_60 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
          this = (result_validity->super_TemplatedValidityMask<unsigned_long>).validity_data.
                 internal.
                 super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
                 ._M_refcount._M_pi;
          (result_validity->super_TemplatedValidityMask<unsigned_long>).validity_data.internal.
          super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
          ._M_ptr = peVar5;
          (result_validity->super_TemplatedValidityMask<unsigned_long>).validity_data.internal.
          super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
          ._M_refcount._M_pi = p_Var6;
          if ((this != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) &&
             (::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this),
             p_Stack_60 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0)) {
            ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Stack_60);
          }
          pTVar8 = shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_true>::operator->
                             (local_50);
          _Var9._M_head_impl =
               (pTVar8->owned_data).
               super_unique_ptr<unsigned_long[],_std::default_delete<unsigned_long[]>_>._M_t.
               super___uniq_ptr_impl<unsigned_long,_std::default_delete<unsigned_long[]>_>._M_t.
               super__Tuple_impl<0UL,_unsigned_long_*,_std::default_delete<unsigned_long[]>_>.
               super__Head_base<0UL,_unsigned_long_*,_false>._M_head_impl;
          (result_validity->super_TemplatedValidityMask<unsigned_long>).validity_mask =
               _Var9._M_head_impl;
          result_data = local_40;
          rdata = local_48;
        }
        bVar4 = (byte)uVar11 & 0x3f;
        _Var9._M_head_impl[uVar11 >> 6] =
             _Var9._M_head_impl[uVar11 >> 6] & (-2L << bVar4 | 0xfffffffffffffffeU >> 0x40 - bVar4);
      }
      uVar11 = uVar11 + 1;
    } while (count != uVar11);
  }
  return;
}

Assistant:

static void ExecuteGenericLoop(const LEFT_TYPE *__restrict ldata, const RIGHT_TYPE *__restrict rdata,
	                               RESULT_TYPE *__restrict result_data, const SelectionVector *__restrict lsel,
	                               const SelectionVector *__restrict rsel, idx_t count, ValidityMask &lvalidity,
	                               ValidityMask &rvalidity, ValidityMask &result_validity, FUNC fun) {
		if (!lvalidity.AllValid() || !rvalidity.AllValid()) {
			for (idx_t i = 0; i < count; i++) {
				auto lindex = lsel->get_index(i);
				auto rindex = rsel->get_index(i);
				if (lvalidity.RowIsValid(lindex) && rvalidity.RowIsValid(rindex)) {
					auto lentry = ldata[lindex];
					auto rentry = rdata[rindex];
					result_data[i] = OPWRAPPER::template Operation<FUNC, OP, LEFT_TYPE, RIGHT_TYPE, RESULT_TYPE>(
					    fun, lentry, rentry, result_validity, i);
				} else {
					result_validity.SetInvalid(i);
				}
			}
		} else {
			for (idx_t i = 0; i < count; i++) {
				auto lentry = ldata[lsel->get_index(i)];
				auto rentry = rdata[rsel->get_index(i)];
				result_data[i] = OPWRAPPER::template Operation<FUNC, OP, LEFT_TYPE, RIGHT_TYPE, RESULT_TYPE>(
				    fun, lentry, rentry, result_validity, i);
			}
		}
	}